

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O2

string * __thiscall
FMB::FiniteModelMultiSorted::toString_abi_cxx11_
          (string *__return_storage_ptr__,FiniteModelMultiSorted *this)

{
  char cVar1;
  uint uVar2;
  Symbol *pSVar3;
  bool bVar4;
  uint *puVar5;
  __type _Var6;
  int iVar7;
  ostream *poVar8;
  string *psVar9;
  OperatorType *pOVar10;
  TermList TVar11;
  Signature *pSVar12;
  uint i;
  ulong uVar13;
  ulong uVar14;
  Symbol **ppSVar15;
  uint i_00;
  uint i_01;
  Symbol **ppSVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  FiniteModelMultiSorted *pFVar21;
  FiniteModelMultiSorted *this_00;
  uint j_1;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint j;
  ulong uVar25;
  long lVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  FiniteModelMultiSorted *pFVar27;
  string sortNameLabel;
  allocator<char> local_461;
  string sortName;
  string cname;
  string local_418;
  string *local_3f8;
  ulong local_3f0;
  ostringstream modelStm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_3f8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&modelStm);
  if ((toString[abi:cxx11]()::cnames_abi_cxx11_ == '\0') &&
     (iVar17 = __cxa_guard_acquire(&toString[abi:cxx11]()::cnames_abi_cxx11_), iVar17 != 0)) {
    toString[abi:cxx11]()::cnames_abi_cxx11_._size = 0;
    toString[abi:cxx11]()::cnames_abi_cxx11_._capacity = 0;
    toString[abi:cxx11]()::cnames_abi_cxx11_._array =
         (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
         )0x0;
    __cxa_atexit(Lib::
                 DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~DArray,&toString[abi:cxx11]()::cnames_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&toString[abi:cxx11]()::cnames_abi_cxx11_);
  }
  Lib::
  DArray<Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ensure(&toString[abi:cxx11]()::cnames_abi_cxx11_,
           (ulong)((long)(DAT_00a14190->_typeCons)._cursor - (long)(DAT_00a14190->_typeCons)._stack)
           >> 3 & 0xffffffff);
  uVar20 = 0;
  pSVar12 = DAT_00a14190;
  pFVar21 = this;
  while( true ) {
    ppSVar15 = (pSVar12->_typeCons)._stack;
    uVar22 = (uint)uVar20;
    if ((uint)((ulong)((long)(pSVar12->_typeCons)._cursor - (long)ppSVar15) >> 3) <= uVar22) break;
    uVar23 = (this->_sizes)._array[uVar20];
    in_stack_fffffffffffffb58 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar23;
    if (3 < uVar22 - 1 && uVar23 != 0) {
      local_3f0 = uVar20;
      std::__cxx11::string::string((string *)&sortName,(string *)ppSVar15[(int)uVar22]);
      std::__cxx11::string::string((string *)&sortNameLabel,(string *)&sortName);
      if (4 < (uint)local_3f0) {
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_b0,(string *)&sortNameLabel);
        prepend(&cname,this,"declare_",&local_b0);
        poVar8 = std::operator<<(poVar8,(string *)&cname);
        poVar8 = std::operator<<(poVar8,",type,");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        poVar8 = std::operator<<(poVar8,":$tType).");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&cname);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      uVar18 = (ulong)((int)in_stack_fffffffffffffb58 + 1);
      Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::ensure(toString[abi:cxx11]()::cnames_abi_cxx11_._array + uVar20,uVar18);
      for (uVar22 = 1; uVar22 <= (uint)in_stack_fffffffffffffb58; uVar22 = uVar22 + 1) {
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_d0,(string *)&sortNameLabel);
        prepend(&local_230,this,"declare_",&local_d0);
        Lib::Int::toString_abi_cxx11_(&local_418,(Int *)(ulong)uVar22,i_00);
        append(&cname,this,&local_230,local_418._M_dataplus._M_p);
        poVar8 = std::operator<<(poVar8,(string *)&cname);
        std::operator<<(poVar8,",type,");
        std::__cxx11::string::~string((string *)&cname);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_d0);
        iVar17 = (this->sortRepr)._array[uVar20]._array[uVar22];
        if (iVar17 < 0) {
          std::__cxx11::string::string((string *)&local_250,(string *)&sortNameLabel);
          prepend(&local_f0,this,"fmb_",&local_250);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"_",&local_461);
          Lib::Int::toString_abi_cxx11_(&local_110,(Int *)(ulong)uVar22,i_01);
          std::operator+(&local_418,&local_270,&local_110);
          append(&cname,this,&local_f0,local_418._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_250);
        }
        else {
          psVar9 = Kernel::Signature::functionName_abi_cxx11_(DAT_00a14190,iVar17);
          std::__cxx11::string::string((string *)&cname,(string *)psVar9);
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   (toString[abi:cxx11]()::cnames_abi_cxx11_._array[uVar20]._array + uVar22));
        poVar8 = std::operator<<((ostream *)&modelStm,(string *)&cname);
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        poVar8 = std::operator<<(poVar8,").");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&cname);
      }
      poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
      std::__cxx11::string::string((string *)&local_130,(string *)&sortNameLabel);
      prepend(&cname,this,"finite_domain_",&local_130);
      poVar8 = std::operator<<(poVar8,(string *)&cname);
      poVar8 = std::operator<<(poVar8,",axiom,");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&cname);
      std::__cxx11::string::~string((string *)&local_130);
      poVar8 = std::operator<<((ostream *)&modelStm,"      ! [X:");
      poVar8 = std::operator<<(poVar8,(string *)&sortName);
      poVar8 = std::operator<<(poVar8,"] : (");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::operator<<((ostream *)&modelStm,"         ");
      iVar17 = -1;
      uVar13 = 1;
      while( true ) {
        uVar22 = (uint)uVar13;
        if ((uint)in_stack_fffffffffffffb58 < uVar22) break;
        poVar8 = std::operator<<((ostream *)&modelStm,"X = ");
        std::operator<<(poVar8,(string *)
                               (toString[abi:cxx11]()::cnames_abi_cxx11_._array[uVar20]._array +
                               uVar13));
        if (uVar22 < (uint)in_stack_fffffffffffffb58) {
          std::operator<<((ostream *)&modelStm," | ");
        }
        if ((uint)in_stack_fffffffffffffb58 == uVar22) {
          std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
        }
        else if ((int)(uVar13 / 5) * 5 + iVar17 == 0) {
          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
          std::operator<<(poVar8,"         ");
        }
        uVar13 = (ulong)(uVar22 + 1);
        iVar17 = iVar17 + -1;
      }
      poVar8 = std::operator<<((ostream *)&modelStm,"      ) ).");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
      if ((int)in_stack_fffffffffffffb58 != 1) {
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_50,(string *)&sortNameLabel);
        prepend(&cname,this,"distinct_domain_",&local_50);
        poVar8 = std::operator<<(poVar8,(string *)&cname);
        poVar8 = std::operator<<(poVar8,",axiom,");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&cname);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator<<((ostream *)&modelStm,"         ");
        iVar17 = (int)in_stack_fffffffffffffb58;
        uVar22 = 0;
        uVar13 = 1;
        this = pFVar21;
        while (uVar13 != uVar18) {
          iVar7 = -uVar22;
          uVar14 = uVar13 + 1 & 0xffffffff;
          while( true ) {
            uVar22 = uVar22 + 1;
            uVar23 = (uint)uVar14;
            if ((uint)in_stack_fffffffffffffb58 < uVar23) break;
            poVar8 = std::operator<<((ostream *)&modelStm,
                                     (string *)
                                     (toString[abi:cxx11]()::cnames_abi_cxx11_._array[uVar20]._array
                                     + uVar13));
            poVar8 = std::operator<<(poVar8," != ");
            std::operator<<(poVar8,(string *)
                                   (toString[abi:cxx11]()::cnames_abi_cxx11_._array[uVar20]._array +
                                   uVar14));
            if (uVar13 == iVar17 - 1 && (uint)in_stack_fffffffffffffb58 == uVar23) {
              std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
            }
            else {
              std::operator<<((ostream *)&modelStm," & ");
              if ((uVar22 / 5) * 5 + iVar7 == 1) {
                poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
                std::operator<<(poVar8,"         ");
              }
            }
            uVar14 = (ulong)(uVar23 + 1);
            iVar7 = iVar7 + -1;
          }
          uVar22 = -iVar7;
          uVar13 = uVar13 + 1;
        }
        poVar8 = std::operator<<((ostream *)&modelStm,").");
        pFVar21 = this;
        poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::__cxx11::string::~string((string *)&sortNameLabel);
      std::__cxx11::string::~string((string *)&sortName);
      pSVar12 = DAT_00a14190;
      uVar20 = local_3f0;
    }
    uVar20 = (ulong)((int)uVar20 + 1);
  }
  uVar20 = 0;
  while( true ) {
    ppSVar15 = (pSVar12->_funs)._stack;
    ppSVar16 = (pSVar12->_funs)._cursor;
    if (((ulong)((long)ppSVar16 - (long)ppSVar15) >> 3 & 0xffffffff) <= uVar20) break;
    pSVar3 = ppSVar15[uVar20];
    if (((pSVar3->_usageCount != 0) && (pSVar3->_arity == 0)) && ((pSVar3->field_0x40 & 4) == 0)) {
      std::__cxx11::string::string((string *)&sortName,(string *)pSVar3);
      uVar18 = (ulong)(pFVar21->_f_interpretation)._array[(pFVar21->_f_offsets)._array[uVar20]];
      pOVar10 = Kernel::Signature::Symbol::fnType(pSVar3);
      uVar22 = *(uint *)(*(long *)(pOVar10->_key + ((ulong)(*(int *)pOVar10->_key - 1) * 2 + 2) * 4)
                        + 8);
      std::__cxx11::string::string
                ((string *)&sortNameLabel,
                 (string *)(toString[abi:cxx11]()::cnames_abi_cxx11_._array[uVar22]._array + uVar18)
                );
      _Var6 = std::operator==(in_stack_fffffffffffffb58,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pFVar21);
      if (!_Var6) {
        std::__cxx11::string::string
                  ((string *)&cname,(string *)(DAT_00a14190->_typeCons)._stack[(int)uVar22]);
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_70,(string *)&sortName);
        prepend(&local_418,pFVar21,"declare_",&local_70);
        poVar8 = std::operator<<(poVar8,(string *)&local_418);
        poVar8 = std::operator<<(poVar8,",type,");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = std::operator<<(poVar8,(string *)&cname);
        poVar8 = std::operator<<(poVar8,").");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_70);
        if (uVar18 == 0) {
          poVar8 = std::operator<<((ostream *)&modelStm,"% ");
          poVar8 = std::operator<<(poVar8,(string *)&sortName);
          poVar8 = std::operator<<(poVar8," undefined in model");
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        else {
          poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
          std::__cxx11::string::string((string *)&local_150,(string *)&sortName);
          append(&local_418,pFVar21,&local_150,"_definition");
          poVar8 = std::operator<<(poVar8,(string *)&local_418);
          poVar8 = std::operator<<(poVar8,",axiom,");
          poVar8 = std::operator<<(poVar8,(string *)&sortName);
          poVar8 = std::operator<<(poVar8," = ");
          poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
          poVar8 = std::operator<<(poVar8,").");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_150);
        }
        std::__cxx11::string::~string((string *)&cname);
      }
      std::__cxx11::string::~string((string *)&sortNameLabel);
      std::__cxx11::string::~string((string *)&sortName);
      pSVar12 = DAT_00a14190;
    }
    uVar20 = uVar20 + 1;
  }
  this_00 = pFVar21;
  for (uVar20 = 0; uVar20 < ((ulong)((long)ppSVar16 - (long)ppSVar15) >> 3 & 0xffffffff);
      uVar20 = uVar20 + 1) {
    pSVar3 = ppSVar15[uVar20];
    if (pSVar3->_usageCount != 0) {
      uVar22 = pSVar3->_arity;
      uVar18 = (ulong)uVar22;
      if ((uVar18 != 0) && ((pSVar3->field_0x40 & 4) == 0)) {
        std::__cxx11::string::string((string *)&sortName,(string *)pSVar3);
        pOVar10 = Kernel::Signature::Symbol::fnType(pSVar3);
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_170,(string *)&sortName);
        prepend(&sortNameLabel,pFVar21,"declare_",&local_170);
        poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
        poVar8 = std::operator<<(poVar8,",type,");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        std::operator<<(poVar8,": (");
        std::__cxx11::string::~string((string *)&sortNameLabel);
        std::__cxx11::string::~string((string *)&local_170);
        uVar23 = 0;
        while (uVar22 != uVar23) {
          cname._M_dataplus._M_p = (pointer)Kernel::OperatorType::arg(pOVar10,uVar23);
          Kernel::TermList::toString_abi_cxx11_(&sortNameLabel,(TermList *)&cname,false);
          std::operator<<((ostream *)&modelStm,(string *)&sortNameLabel);
          std::__cxx11::string::~string((string *)&sortNameLabel);
          uVar23 = uVar23 + 1;
          if (uVar23 < uVar22) {
            std::operator<<((ostream *)&modelStm," * ");
          }
        }
        poVar8 = std::operator<<((ostream *)&modelStm,") > ");
        cname._M_dataplus._M_p =
             *(pointer *)(pOVar10->_key + ((ulong)(*(int *)pOVar10->_key - 1) * 2 + 2) * 4);
        Kernel::TermList::toString_abi_cxx11_(&sortNameLabel,(TermList *)&cname,false);
        poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
        poVar8 = std::operator<<(poVar8,").");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&sortNameLabel);
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_190,(string *)&sortName);
        prepend(&sortNameLabel,pFVar21,"function_",&local_190);
        poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
        poVar8 = std::operator<<(poVar8,",axiom,");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&sortNameLabel);
        std::__cxx11::string::~string((string *)&local_190);
        uVar23 = (pFVar21->_f_offsets)._array[uVar20];
        if ((toString[abi:cxx11]()::args == '\0') &&
           (iVar17 = __cxa_guard_acquire(&toString[abi:cxx11]()::args), iVar17 != 0)) {
          toString::args._size = 0;
          toString::args._capacity = 0;
          toString::args._array = (uint *)0x0;
          __cxa_atexit(Lib::DArray<unsigned_int>::~DArray,&toString::args,&__dso_handle);
          __cxa_guard_release(&toString[abi:cxx11]()::args);
        }
        Lib::DArray<unsigned_int>::ensure(&toString::args,uVar18);
        puVar5 = toString::args._array;
        for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
          puVar5[uVar13] = 1;
        }
        uVar14 = (ulong)(uVar22 - 1);
        puVar5[uVar14] = 0;
        bVar4 = true;
        uVar13 = uVar14;
        pFVar27 = this_00;
        while (this_00 = pFVar27, uVar22 = (uint)uVar13, uVar22 != 0xffffffff) {
          TVar11 = Kernel::OperatorType::arg(pOVar10,uVar22);
          if (toString::args._array[uVar13] ==
              (pFVar21->_sizes)._array[*(uint *)(TVar11._content + 8)]) {
            toString::args._array[uVar13] = 1;
            uVar13 = (ulong)(uVar22 - 1);
            pFVar27 = this_00;
          }
          else {
            toString::args._array[uVar13] = toString::args._array[uVar13] + 1;
            iVar17 = 1;
            uVar22 = uVar23;
            for (uVar24 = 0; uVar24 < toString::args._size; uVar24 = uVar24 + 1) {
              uVar2 = toString::args._array[uVar24];
              TVar11 = Kernel::OperatorType::arg(pOVar10,uVar24);
              uVar22 = uVar22 + (uVar2 - 1) * iVar17;
              iVar17 = iVar17 * (this_00->_sizes)._array[*(uint *)(TVar11._content + 8)];
            }
            uVar13 = (ulong)(this_00->_f_interpretation)._array[uVar22];
            pFVar27 = this_00;
            if (uVar13 == 0) {
              std::operator<<((ostream *)&modelStm,"%         ");
            }
            else {
              pcVar19 = "         & ";
              if (bVar4) {
                pcVar19 = "           ";
              }
              std::operator<<((ostream *)&modelStm,pcVar19);
              bVar4 = false;
            }
            poVar8 = std::operator<<((ostream *)&modelStm,(string *)&sortName);
            std::operator<<(poVar8,"(");
            for (uVar25 = 0; uVar18 != uVar25; uVar25 = uVar25 + 1) {
              if (uVar25 != 0) {
                std::operator<<((ostream *)&modelStm,",");
              }
              TVar11 = Kernel::OperatorType::arg(pOVar10,(uint)uVar25);
              std::operator<<((ostream *)&modelStm,
                              (string *)
                              (toString[abi:cxx11]()::cnames_abi_cxx11_._array
                               [*(uint *)(TVar11._content + 8)]._array +
                              toString::args._array[uVar25]));
            }
            pFVar21 = this_00;
            if (uVar13 == 0) {
              poVar8 = std::operator<<((ostream *)&modelStm,") undefined in model");
              std::endl<char,std::char_traits<char>>(poVar8);
              uVar13 = uVar14;
            }
            else {
              uVar22 = *(uint *)(*(long *)(pOVar10->_key +
                                          ((ulong)(*(int *)pOVar10->_key - 1) * 2 + 2) * 4) + 8);
              poVar8 = std::operator<<((ostream *)&modelStm,") = ");
              poVar8 = std::operator<<(poVar8,(string *)
                                              (toString[abi:cxx11]()::cnames_abi_cxx11_._array
                                               [uVar22]._array + uVar13));
              std::endl<char,std::char_traits<char>>(poVar8);
              uVar13 = uVar14;
            }
          }
        }
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
        poVar8 = std::operator<<(poVar8,").");
        poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&sortName);
        ppSVar15 = (DAT_00a14190->_funs)._stack;
        ppSVar16 = (DAT_00a14190->_funs)._cursor;
        pSVar12 = DAT_00a14190;
      }
    }
  }
  lVar26 = 1;
  do {
    ppSVar15 = (pSVar12->_preds)._stack;
    ppSVar16 = (pSVar12->_preds)._cursor;
    if ((uint)((ulong)((long)ppSVar16 - (long)ppSVar15) >> 3) <= (uint)lVar26) {
      pFVar21 = this_00;
      for (uVar20 = 1; uVar20 < ((ulong)((long)ppSVar16 - (long)ppSVar15) >> 3 & 0xffffffff);
          uVar20 = uVar20 + 1) {
        pSVar3 = ppSVar15[uVar20];
        uVar22 = pSVar3->_arity;
        uVar18 = (ulong)uVar22;
        if (((uVar18 != 0) && ((pSVar3->field_0x40 & 4) == 0)) && (pSVar3->_usageCount != 0)) {
          std::__cxx11::string::string((string *)&sortName,(string *)pSVar3);
          pOVar10 = Kernel::Signature::Symbol::predType(pSVar3);
          poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
          std::__cxx11::string::string((string *)&local_1f0,(string *)&sortName);
          prepend(&sortNameLabel,this_00,"declare_",&local_1f0);
          poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
          poVar8 = std::operator<<(poVar8,",type,");
          poVar8 = std::operator<<(poVar8,(string *)&sortName);
          std::operator<<(poVar8,": (");
          std::__cxx11::string::~string((string *)&sortNameLabel);
          std::__cxx11::string::~string((string *)&local_1f0);
          uVar23 = 0;
          while (uVar22 != uVar23) {
            TVar11 = Kernel::OperatorType::arg(pOVar10,uVar23);
            std::operator<<((ostream *)&modelStm,
                            (string *)
                            (DAT_00a14190->_typeCons)._stack[*(int *)(TVar11._content + 8)]);
            uVar23 = uVar23 + 1;
            if (uVar23 < uVar22) {
              std::operator<<((ostream *)&modelStm," * ");
            }
          }
          poVar8 = std::operator<<((ostream *)&modelStm,") > $o).");
          std::endl<char,std::char_traits<char>>(poVar8);
          poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
          std::__cxx11::string::string((string *)&local_210,(string *)&sortName);
          prepend(&sortNameLabel,this_00,"predicate_",&local_210);
          poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
          poVar8 = std::operator<<(poVar8,",axiom,");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)&sortNameLabel);
          std::__cxx11::string::~string((string *)&local_210);
          uVar23 = (this_00->_p_offsets)._array[uVar20];
          if ((toString[abi:cxx11]()::args == '\0') &&
             (iVar17 = __cxa_guard_acquire(&toString[abi:cxx11]()::args), iVar17 != 0)) {
            toString[abi:cxx11]()::args._size = 0;
            toString[abi:cxx11]()::args._capacity = 0;
            toString[abi:cxx11]()::args._array = (uint *)0x0;
            __cxa_atexit(Lib::DArray<unsigned_int>::~DArray,&toString[abi:cxx11]()::args,
                         &__dso_handle);
            __cxa_guard_release(&toString[abi:cxx11]()::args);
          }
          Lib::DArray<unsigned_int>::ensure(&toString[abi:cxx11]()::args,uVar18);
          puVar5 = toString[abi:cxx11]()::args._array;
          for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
            puVar5[uVar13] = 1;
          }
          uVar14 = (ulong)(uVar22 - 1);
          puVar5[uVar14] = 0;
          bVar4 = true;
          uVar13 = uVar14;
          while (uVar22 = (uint)uVar13, uVar22 != 0xffffffff) {
            TVar11 = Kernel::OperatorType::arg(pOVar10,uVar22);
            if (toString[abi:cxx11]()::args._array[uVar13] ==
                (this_00->_sizes)._array[*(uint *)(TVar11._content + 8)]) {
              toString[abi:cxx11]()::args._array[uVar13] = 1;
              uVar13 = (ulong)(uVar22 - 1);
            }
            else {
              toString[abi:cxx11]()::args._array[uVar13] =
                   toString[abi:cxx11]()::args._array[uVar13] + 1;
              uVar24 = 0;
              iVar17 = 1;
              uVar22 = uVar23;
              while( true ) {
                if (toString[abi:cxx11]()::args._size <= uVar24) break;
                uVar2 = toString[abi:cxx11]()::args._array[uVar24];
                this_00 = pFVar21;
                TVar11 = Kernel::OperatorType::arg(pOVar10,uVar24);
                uVar22 = uVar22 + (uVar2 - 1) * iVar17;
                iVar17 = iVar17 * (this_00->_sizes)._array[*(uint *)(TVar11._content + 8)];
                uVar24 = uVar24 + 1;
                pFVar21 = this_00;
              }
              cVar1 = (this_00->_p_interpretation)._array[uVar22];
              if (cVar1 < '\x01') {
                std::operator<<((ostream *)&modelStm,"%         ");
              }
              else {
                pcVar19 = "         & ";
                if (bVar4) {
                  pcVar19 = "           ";
                }
                std::operator<<((ostream *)&modelStm,pcVar19);
                if (cVar1 == '\x01') {
                  std::operator<<((ostream *)&modelStm,"~");
                }
                bVar4 = false;
              }
              poVar8 = std::operator<<((ostream *)&modelStm,(string *)&sortName);
              std::operator<<(poVar8,"(");
              for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
                if (uVar13 != 0) {
                  std::operator<<((ostream *)&modelStm,",");
                }
                TVar11 = Kernel::OperatorType::arg(pOVar10,(uint)uVar13);
                std::operator<<((ostream *)&modelStm,
                                (string *)
                                (toString[abi:cxx11]()::cnames_abi_cxx11_._array
                                 [*(uint *)(TVar11._content + 8)]._array +
                                toString[abi:cxx11]()::args._array[uVar13]));
              }
              std::operator<<((ostream *)&modelStm,")");
              if (cVar1 == '\0') {
                std::operator<<((ostream *)&modelStm," undefined in model");
              }
              std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
              uVar13 = uVar14;
            }
          }
          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&modelStm);
          poVar8 = std::operator<<(poVar8,").");
          poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)&sortName);
          ppSVar15 = (DAT_00a14190->_preds)._stack;
          ppSVar16 = (DAT_00a14190->_preds)._cursor;
        }
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modelStm);
      return local_3f8;
    }
    if (((ppSVar15[(int)(uint)lVar26]->_arity == 0) &&
        (pSVar3 = ppSVar15[lVar26], (pSVar3->field_0x40 & 4) == 0)) && (pSVar3->_usageCount != 0)) {
      std::__cxx11::string::string((string *)&sortName,(string *)pSVar3);
      poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
      std::__cxx11::string::string((string *)&local_90,(string *)&sortName);
      prepend(&sortNameLabel,this_00,"declare_",&local_90);
      poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
      poVar8 = std::operator<<(poVar8,",type,");
      poVar8 = std::operator<<(poVar8,(string *)&sortName);
      poVar8 = std::operator<<(poVar8,": $o).");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&sortNameLabel);
      std::__cxx11::string::~string((string *)&local_90);
      cVar1 = (this_00->_p_interpretation)._array[(this_00->_p_offsets)._array[lVar26]];
      if (cVar1 == '\x01') {
        poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
        std::__cxx11::string::string((string *)&local_1d0,(string *)&sortName);
        append(&sortNameLabel,this_00,&local_1d0,"_definition");
        poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
        poVar8 = std::operator<<(poVar8,",axiom,~");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        poVar8 = std::operator<<(poVar8,").");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&sortNameLabel);
        psVar9 = &local_1d0;
LAB_0025f2fb:
        std::__cxx11::string::~string((string *)psVar9);
      }
      else {
        if (cVar1 == '\x02') {
          poVar8 = std::operator<<((ostream *)&modelStm,"tff(");
          std::__cxx11::string::string((string *)&local_1b0,(string *)&sortName);
          append(&sortNameLabel,this_00,&local_1b0,"_definition");
          poVar8 = std::operator<<(poVar8,(string *)&sortNameLabel);
          poVar8 = std::operator<<(poVar8,",axiom,");
          poVar8 = std::operator<<(poVar8,(string *)&sortName);
          poVar8 = std::operator<<(poVar8,").");
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__cxx11::string::~string((string *)&sortNameLabel);
          psVar9 = &local_1b0;
          goto LAB_0025f2fb;
        }
        poVar8 = std::operator<<((ostream *)&modelStm,"% ");
        poVar8 = std::operator<<(poVar8,(string *)&sortName);
        poVar8 = std::operator<<(poVar8," undefined");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::__cxx11::string::~string((string *)&sortName);
      pSVar12 = DAT_00a14190;
    }
    lVar26 = lVar26 + 1;
  } while( true );
}

Assistant:

std::string FiniteModelMultiSorted::toString()
{
  std::ostringstream modelStm;

  bool printIntroduced = false;

  static DArray<DArray<std::string>> cnames;
  cnames.ensure(env.signature->typeCons());

  //Output sorts and their sizes
  for(unsigned s=0;s<env.signature->typeCons();s++){
    unsigned size = _sizes[s];
    if(size==0) continue;

    // don't output interpreted sorts at all, we know what they are
    if(env.signature->isInterpretedNonDefault(s))
      continue;

    std::string sortName = env.signature->typeConName(s);
    std::string sortNameLabel = (env.signature->isBoolCon(s)) ? "bool" : sortName;

    // skip declaring $i, we know what it is
    if(!env.signature->isDefaultSortCon(s))
      // Sort declaration
      modelStm << "tff(" << prepend("declare_", sortNameLabel) << ",type,"<<sortName<<":$tType)." <<endl;

    cnames[s].ensure(size+1);

    // Domain constant declarations
    for(unsigned i=1;i<=size;i++){
      modelStm << "tff(" << append(prepend("declare_", sortNameLabel), Int::toString(i).c_str()) << ",type,";
      int frep = sortRepr[s][i];
      std::string cname = (frep >= 0) ? env.signature->functionName(frep) : append(prepend("fmb_", sortNameLabel),(std::string("_")+Lib::Int::toString(i)).c_str());
      cnames[s][i]=cname;
      modelStm << cname << ":" << sortName << ")." << endl;
    }

    //Output domain
    modelStm << "tff(" << prepend("finite_domain_", sortNameLabel) << ",axiom," << endl;
    modelStm << "      ! [X:" << sortName << "] : (" << endl;
    modelStm << "         ";
    for(unsigned i=1;i<=size;i++){
      modelStm << "X = " << cnames[s][i];
      if(i<size) modelStm << " | ";
      if(i==size) modelStm << endl;
      else if(i%5==0) modelStm << endl << "         ";
    }
    modelStm << "      ) )." <<endl;
    //Distinctness of domain
    modelStm << endl;
    if(size>1){
    modelStm << "tff(" << prepend("distinct_domain_", sortNameLabel) << ",axiom," << endl;
    modelStm << "         ";
    unsigned c=0;
    for(unsigned i=1;i<=size;i++){
      for(unsigned j=i+1;j<=size;j++){
        c++;
        modelStm << cnames[s][i] <<" != " << cnames[s][j];
        if(!(i==size-1 && j==size)){
           modelStm << " & ";
           if(c%5==0){ modelStm << endl << "         "; }
        }
        else{ modelStm << endl; }
      }
    }
    modelStm << ")." << endl << endl;
    }
  }

  //Constants
  for(unsigned f=0;f<env.signature->functions();f++){
    Signature::Symbol* symb = env.signature->getFunction(f);
    if(symb->usageCnt()==0) continue;
    unsigned arity = symb->arity();
    if(arity>0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    std::string name = symb->name();
    unsigned res = _f_interpretation[_f_offsets[f]];
    TermList srtT = symb->fnType()->result();
    unsigned srt = srtT.term()->functor();
    std::string cname = cnames[srt][res];
    if(name == cname) continue;

    std::string sortName = env.signature->typeConName(srt);
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<":"<<sortName<<")."<<endl;
    if(res>0){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,"<<name<<" = " << cname << ")."<<endl;
    }
    else{
      modelStm << "% " << name << " undefined in model" << endl;
    }
  }

  //Functions
  for(unsigned f=0;f<env.signature->functions();f++){
    Signature::Symbol* symb = env.signature->getFunction(f);
    if(symb->usageCnt()==0) continue;
    unsigned arity = symb->arity();
    if(arity==0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    std::string name = symb->name();
    OperatorType* sig = symb->fnType();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": (";
    for(unsigned i=0;i<arity;i++){
      modelStm << sig->arg(i).toString();
      if(i+1 < arity) modelStm << " * ";
    }
    modelStm << ") > " << sig->result().toString() << ")." << endl;

    modelStm << "tff("<<prepend("function_", name)<<",axiom,"<<endl;

    unsigned offset = _f_offsets[f];

    static DArray<unsigned> args;
    args.ensure(arity);
    for(unsigned i=0;i<arity;i++) args[i]=1;
    args[arity-1]=0;
    bool first=true;
fModelLabel:
      for(unsigned i=arity-1;i+1!=0;i--){

        TermList argST = sig->arg(i);
        unsigned argS = argST.term()->functor();
        if(args[i]==_sizes[argS]){
          args[i]=1;
        }
        else{
          args[i]++;

          //TODO could probably compute this directly, instead of via args
          // my mind isn't in the right place to do that now though!
          unsigned var = offset;
          unsigned mult=1;
          for(unsigned i=0;i<args.size();i++){
            var += mult*(args[i]-1);
            unsigned s = sig->arg(i).term()->functor();
            mult *= _sizes[s];
          }
          unsigned res = _f_interpretation[var];

          if(res>0){
            if(!first){ modelStm << "         & " ; }
            else{ modelStm << "           " ; }
            first=false;
          }
          else{
            modelStm << "%         ";
          }
          modelStm << name << "(";
          for(unsigned j=0;j<arity;j++){
            if(j!=0) modelStm << ",";
            TermList argSortT = sig->arg(j);
            unsigned argSort = argSortT.term()->functor();
            modelStm << cnames[argSort][args[j]];
          }
          if(res>0){
            TermList resultSortT = sig->result();
            unsigned resultSort = resultSortT.term()->functor();
            modelStm << ") = " << cnames[resultSort][res] << endl;
          }
          else{
            modelStm << ") undefined in model" << endl;
          }
          goto fModelLabel;
        }
      }
      modelStm << endl << ")." << endl << endl;
  }

  //Propositions
  for(unsigned p=1;p<env.signature->predicates();p++){
    unsigned arity = env.signature->predicateArity(p);
    if(arity>0) continue;
    Signature::Symbol* symb = env.signature->getPredicate(p);
    if(!printIntroduced && symb->introduced()) continue;
    if(symb->usageCnt() == 0) continue;
    std::string name = symb->name();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": $o)."<<endl;
    char res = _p_interpretation[_p_offsets[p]];
    if(res==INTP_TRUE){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,"<<name<< ")."<<endl;
    }
    else if(res==INTP_FALSE){
      modelStm << "tff("<<append(name,"_definition")<<",axiom,~"<<name<< ")."<<endl;
    }
    else{
      modelStm << "% " << name << " undefined" << endl;
    }
  }

  //Predicates
  for(unsigned p=1;p<env.signature->predicates();p++){
    Signature::Symbol* symb = env.signature->getPredicate(p);
    unsigned arity = symb->arity();
    if(arity==0) continue;
    if(!printIntroduced && symb->introduced()) continue;
    if(symb->usageCnt() == 0) continue;
    std::string name = symb->name();
    OperatorType* sig = symb->predType();
    modelStm << "tff("<<prepend("declare_", name)<<",type,"<<name<<": (";
    for(unsigned i=0;i<arity;i++){
      TermList argST = sig->arg(i);
      unsigned argS = argST.term()->functor();
      modelStm << env.signature->typeConName(argS);
      if(i+1 < arity) modelStm << " * ";
    }
    modelStm << ") > $o)." << endl;

    modelStm << "tff("<<prepend("predicate_", name)<<",axiom,"<<endl;

    unsigned offset = _p_offsets[p];

    static DArray<unsigned> args;
    args.ensure(arity);
    for(unsigned i=0;i<arity;i++) args[i]=1;
    args[arity-1]=0;
    bool first=true;
pModelLabel:
      for(unsigned i=arity-1;i+1!=0;i--){
        TermList argST = sig->arg(i);
        unsigned argS = argST.term()->functor();
        if(args[i]==_sizes[argS]){
          args[i]=1;
        }
        else{
          args[i]++;

          //TODO could probably compute this directly, instead of via args
          // my mind isn't in the right place to do that now though!
          unsigned var = offset;
          unsigned mult=1;
          for(unsigned i=0;i<args.size();i++){
            var += mult*(args[i]-1);
            unsigned s = sig->arg(i).term()->functor();
            mult *= _sizes[s];
          }
          char res = _p_interpretation[var];
          if(res>INTP_UNDEF){
            if(!first){ modelStm << "         & " ; }
            else{ modelStm << "           " ; }
            first=false;
          }
          else{
            modelStm << "%         ";
          }
          if(res==INTP_FALSE) modelStm << "~";
          modelStm << name << "(";
          for(unsigned j=0;j<arity;j++){
            if(j!=0) modelStm << ",";
            TermList argSortT = sig->arg(j);
            unsigned argSort = argSortT.term()->functor();
            modelStm << cnames[argSort][args[j]];
          }
          modelStm << ")";
          if(res==INTP_UNDEF){
            modelStm << " undefined in model";
          }
          modelStm << endl;
          goto pModelLabel;
        }
      }
      modelStm << endl << ")." << endl << endl;
  }

  return modelStm.str();
}